

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::Expression(SQCompiler *this)

{
  SQInteger SVar1;
  bool bVar2;
  undefined7 uVar3;
  SQFuncState *pSVar4;
  SQFuncState *pSVar5;
  SQCompiler *in_RDI;
  SQInteger second_exp;
  SQInteger jmppos;
  SQInteger endfirstexp;
  SQInteger first_exp;
  SQInteger trg;
  SQInteger jzpos;
  SQInteger dst_1;
  SQInteger src_1;
  SQInteger dst;
  SQInteger src;
  SQInteger pos;
  SQInteger ds;
  SQInteger op;
  SQExpState es;
  SQCompiler *in_stack_ffffffffffffff30;
  SQFuncState *in_stack_ffffffffffffff38;
  SQFuncState *this_00;
  SQFuncState *in_stack_ffffffffffffff40;
  long arg2;
  SQInteger in_stack_ffffffffffffff48;
  SQInteger arg1;
  SQOpcode op_00;
  long pos_00;
  SQCompiler *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  SQInteger in_stack_ffffffffffffffa8;
  SQInteger in_stack_ffffffffffffffb0;
  SQInteger in_stack_ffffffffffffffb8;
  SQCompiler *this_01;
  SQInteger in_stack_ffffffffffffffd0;
  SQCompiler *this_02;
  SQCompiler *in_stack_fffffffffffffff0;
  
  bVar2 = (in_RDI->_es).donot_get;
  uVar3 = *(undefined7 *)&(in_RDI->_es).field_0x11;
  this_02 = (SQCompiler *)(in_RDI->_es).etype;
  SVar1 = (in_RDI->_es).epos;
  (in_RDI->_es).etype = 1;
  (in_RDI->_es).epos = -1;
  (in_RDI->_es).donot_get = false;
  LogicalOrExp((SQCompiler *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  pos_00 = in_RDI->_token;
  if (pos_00 != 0x3d) {
    if (pos_00 == 0x3f) {
      Lex(in_stack_ffffffffffffff30);
      this_00 = in_RDI->_fs;
      SQFuncState::PopTarget(in_stack_ffffffffffffff40);
      SQFuncState::AddInstruction
                ((SQFuncState *)in_stack_ffffffffffffff60,(SQOpcode)((ulong)pos_00 >> 0x20),
                 (SQInteger)in_RDI,in_stack_ffffffffffffff48,(SQInteger)in_stack_ffffffffffffff40,
                 (SQInteger)this_00);
      SQFuncState::GetCurrentPos((SQFuncState *)0x129d63);
      pSVar4 = (SQFuncState *)SQFuncState::PushTarget(this_00,(SQInteger)in_stack_ffffffffffffff30);
      Expression(in_stack_fffffffffffffff0);
      pSVar5 = (SQFuncState *)SQFuncState::PopTarget(in_stack_ffffffffffffff40);
      if (pSVar4 != pSVar5) {
        SQFuncState::AddInstruction
                  ((SQFuncState *)in_stack_ffffffffffffff60,(SQOpcode)((ulong)pos_00 >> 0x20),
                   (SQInteger)in_RDI,in_stack_ffffffffffffff48,(SQInteger)in_stack_ffffffffffffff40,
                   (SQInteger)this_00);
      }
      SQFuncState::GetCurrentPos((SQFuncState *)0x129de1);
      SQFuncState::AddInstruction
                ((SQFuncState *)in_stack_ffffffffffffff60,(SQOpcode)((ulong)pos_00 >> 0x20),
                 (SQInteger)in_RDI,in_stack_ffffffffffffff48,(SQInteger)in_stack_ffffffffffffff40,
                 (SQInteger)this_00);
      Expect(this_02,in_stack_ffffffffffffffd0);
      SQFuncState::GetCurrentPos((SQFuncState *)0x129e32);
      Expression(in_stack_fffffffffffffff0);
      pSVar5 = (SQFuncState *)SQFuncState::PopTarget(in_stack_ffffffffffffff40);
      if (pSVar4 != pSVar5) {
        SQFuncState::AddInstruction
                  (pSVar5,(SQOpcode)((ulong)pos_00 >> 0x20),(SQInteger)in_RDI,
                   in_stack_ffffffffffffff48,(SQInteger)in_stack_ffffffffffffff40,(SQInteger)this_00
                  );
      }
      SQFuncState::GetCurrentPos((SQFuncState *)0x129ea5);
      SQFuncState::SetIntructionParam(pSVar5,pos_00,(SQInteger)in_RDI,in_stack_ffffffffffffff48);
      SQFuncState::SetIntructionParam(pSVar5,pos_00,(SQInteger)in_RDI,in_stack_ffffffffffffff48);
      SQFuncState::SnoozeOpt(in_RDI->_fs);
      goto LAB_00129ef4;
    }
    if (((pos_00 != 0x119) && (1 < pos_00 - 0x121U)) && (2 < pos_00 - 0x13dU)) goto LAB_00129ef4;
  }
  arg1 = in_RDI->_token;
  arg2 = (in_RDI->_es).etype;
  this_01 = (SQCompiler *)(in_RDI->_es).epos;
  if (arg2 == 1) {
    Error(in_RDI,"can\'t assign expression");
    op_00 = (SQOpcode)((ulong)pos_00 >> 0x20);
  }
  else {
    if (arg2 == 3) {
      Error(in_RDI,"\'base\' cannot be modified");
    }
    op_00 = (SQOpcode)((ulong)pos_00 >> 0x20);
  }
  Lex(in_stack_ffffffffffffff30);
  Expression(in_stack_fffffffffffffff0);
  if (arg1 == 0x3d) {
    if (arg2 - 2U < 2) {
      EmitDerefOp(in_stack_ffffffffffffff60,op_00);
    }
    else if (arg2 == 4) {
      SQFuncState::PopTarget((SQFuncState *)0x4);
      SQFuncState::TopTarget((SQFuncState *)0x129c42);
      SQFuncState::AddInstruction
                ((SQFuncState *)in_stack_ffffffffffffff60,op_00,(SQInteger)in_RDI,arg1,arg2,
                 (SQInteger)in_stack_ffffffffffffff38);
    }
    else if (arg2 == 5) {
      SQFuncState::PopTarget((SQFuncState *)0x5);
      SQFuncState::PushTarget(in_stack_ffffffffffffff38,(SQInteger)in_stack_ffffffffffffff30);
      SQFuncState::AddInstruction
                ((SQFuncState *)in_stack_ffffffffffffff60,op_00,(SQInteger)in_RDI,arg1,arg2,
                 (SQInteger)in_stack_ffffffffffffff38);
    }
  }
  else if (arg1 == 0x119) {
    if ((arg2 == 2) || (arg2 == 3)) {
      EmitDerefOp(in_stack_ffffffffffffff60,op_00);
    }
    else {
      Error(in_RDI,"can\'t \'create\' a local slot");
    }
  }
  else if ((arg1 - 0x121U < 2) || (arg1 - 0x13dU < 3)) {
    EmitCompoundArith(this_01,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                      in_stack_ffffffffffffffa8);
  }
LAB_00129ef4:
  (in_RDI->_es).etype = (SQInteger)this_02;
  (in_RDI->_es).epos = SVar1;
  (in_RDI->_es).donot_get = bVar2;
  *(undefined7 *)&(in_RDI->_es).field_0x11 = uVar3;
  return;
}

Assistant:

void Expression()
    {
         SQExpState es = _es;
        _es.etype     = EXPR;
        _es.epos      = -1;
        _es.donot_get = false;
        LogicalOrExp();
        switch(_token)  {
        case _SC('='):
        case TK_NEWSLOT:
        case TK_MINUSEQ:
        case TK_PLUSEQ:
        case TK_MULEQ:
        case TK_DIVEQ:
        case TK_MODEQ:{
            SQInteger op = _token;
            SQInteger ds = _es.etype;
            SQInteger pos = _es.epos;
            if(ds == EXPR) Error(_SC("can't assign expression"));
            else if(ds == BASE) Error(_SC("'base' cannot be modified"));
            Lex(); Expression();

            switch(op){
            case TK_NEWSLOT:
                if(ds == OBJECT || ds == BASE)
                    EmitDerefOp(_OP_NEWSLOT);
                else //if _derefstate != DEREF_NO_DEREF && DEREF_FIELD so is the index of a local
                    Error(_SC("can't 'create' a local slot"));
                break;
            case _SC('='): //ASSIGN
                switch(ds) {
                case LOCAL:
                    {
                        SQInteger src = _fs->PopTarget();
                        SQInteger dst = _fs->TopTarget();
                        _fs->AddInstruction(_OP_MOVE, dst, src);
                    }
                    break;
                case OBJECT:
                case BASE:
                    EmitDerefOp(_OP_SET);
                    break;
                case OUTER:
                    {
                        SQInteger src = _fs->PopTarget();
                        SQInteger dst = _fs->PushTarget();
                        _fs->AddInstruction(_OP_SETOUTER, dst, pos, src);
                    }
                }
                break;
            case TK_MINUSEQ:
            case TK_PLUSEQ:
            case TK_MULEQ:
            case TK_DIVEQ:
            case TK_MODEQ:
                EmitCompoundArith(op, ds, pos);
                break;
            }
            }
            break;
        case _SC('?'): {
            Lex();
            _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
            SQInteger jzpos = _fs->GetCurrentPos();
            SQInteger trg = _fs->PushTarget();
            Expression();
            SQInteger first_exp = _fs->PopTarget();
            if(trg != first_exp) _fs->AddInstruction(_OP_MOVE, trg, first_exp);
            SQInteger endfirstexp = _fs->GetCurrentPos();
            _fs->AddInstruction(_OP_JMP, 0, 0);
            Expect(_SC(':'));
            SQInteger jmppos = _fs->GetCurrentPos();
            Expression();
            SQInteger second_exp = _fs->PopTarget();
            if(trg != second_exp) _fs->AddInstruction(_OP_MOVE, trg, second_exp);
            _fs->SetIntructionParam(jmppos, 1, _fs->GetCurrentPos() - jmppos);
            _fs->SetIntructionParam(jzpos, 1, endfirstexp - jzpos + 1);
            _fs->SnoozeOpt();
            }
            break;
        }
        _es = es;
    }